

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

int * floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,float *logmdct,float *logmask)

{
  float fVar1;
  vorbis_info_floor1 *info;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  lsfit_acc *a;
  int hy0;
  int ly1;
  uint local_1404;
  int hy1;
  int ly0;
  vorbis_look_floor1 *local_13f8;
  long local_13f0;
  float *local_13e8;
  float *local_13e0;
  long local_13d8;
  int local_13d0;
  uint local_13cc;
  int local_13c8;
  uint local_13c4;
  vorbis_block *local_13c0;
  long local_13b8;
  long local_13b0;
  long local_13a8;
  long local_13a0;
  long local_1398;
  int y1;
  int y0;
  int fit_valueB [65];
  int fit_valueA [65];
  int hineighbor [65];
  int loneighbor [65];
  int memo [65];
  lsfit_acc fits [64];
  
  info = look->vi;
  iVar4 = look->n;
  iVar3 = look->posts;
  local_13f0 = (long)iVar3;
  lVar10 = 0;
  lVar15 = 0;
  if (0 < local_13f0) {
    lVar15 = local_13f0;
  }
  for (; lVar15 != lVar10; lVar10 = lVar10 + 1) {
    fit_valueA[lVar10] = -200;
  }
  for (lVar10 = 0; lVar15 != lVar10; lVar10 = lVar10 + 1) {
    fit_valueB[lVar10] = -200;
  }
  for (lVar10 = 0; lVar15 != lVar10; lVar10 = lVar10 + 1) {
    loneighbor[lVar10] = 0;
  }
  for (lVar10 = 0; lVar15 != lVar10; lVar10 = lVar10 + 1) {
    hineighbor[lVar10] = 1;
  }
  for (lVar10 = 0; lVar15 != lVar10; lVar10 = lVar10 + 1) {
    memo[lVar10] = -1;
  }
  local_13f8 = look;
  local_13e8 = logmdct;
  local_13e0 = logmask;
  local_13c0 = vb;
  if (iVar3 == 0) {
    iVar4 = accumulate_fit(logmask,logmdct,0,iVar4,fits,iVar4,info);
    lVar15 = (long)iVar4;
  }
  else {
    lVar10 = 1;
    lVar11 = lVar10;
    if (1 < local_13f0) {
      lVar11 = local_13f0;
    }
    a = fits;
    lVar15 = 0;
    for (; look = local_13f8, lVar11 != lVar10; lVar10 = lVar10 + 1) {
      iVar3 = accumulate_fit(local_13e0,local_13e8,local_13f8->sorted_index[lVar10 + -1],
                             local_13f8->sorted_index[lVar10],a,iVar4,info);
      lVar15 = lVar15 + iVar3;
      a = a + 1;
    }
  }
  puVar7 = (uint *)0x0;
  if (lVar15 != 0) {
    y0 = -200;
    y1 = -200;
    fit_line(fits,(int)local_13f0 + -1,&y0,&y1,info);
    fit_valueA[0] = y0;
    fit_valueB[0] = y0;
    fit_valueB[1] = y1;
    fit_valueA[1] = y1;
    lVar10 = local_13f0;
    for (lVar15 = 2; lVar15 < lVar10; lVar15 = lVar15 + 1) {
      iVar4 = look->reverse_index[lVar15];
      lVar11 = (long)iVar4;
      lVar13 = (long)loneighbor[lVar11];
      iVar3 = hineighbor[lVar11];
      if (memo[lVar13] != iVar3) {
        lVar10 = (long)iVar3;
        iVar5 = look->reverse_index[lVar13];
        local_13a8 = (long)iVar5;
        local_13c8 = look->reverse_index[lVar10];
        memo[lVar13] = iVar3;
        uVar12 = fit_valueA[lVar13];
        uVar9 = fit_valueB[lVar13];
        uVar21 = uVar9;
        if ((-1 < (int)uVar12) && (uVar21 = uVar12, -1 < (int)uVar9)) {
          uVar21 = uVar9 + uVar12 >> 1;
        }
        uVar12 = fit_valueA[lVar10];
        uVar9 = fit_valueB[lVar10];
        uVar6 = uVar9;
        if ((-1 < (int)uVar12) && (uVar6 = uVar12, -1 < (int)uVar9)) {
          uVar6 = uVar9 + uVar12 >> 1;
        }
        local_13d8 = lVar15;
        local_13d0 = iVar3;
        local_13a0 = lVar11;
        if ((uVar21 == 0xffffffff) || (uVar6 == 0xffffffff)) {
          exit(1);
        }
        lVar17 = (long)info->postlist[lVar13];
        local_1398 = (long)info->postlist[lVar10];
        iVar14 = uVar6 - uVar21;
        iVar16 = info->postlist[lVar10] - info->postlist[lVar13];
        iVar3 = -iVar14;
        if (0 < iVar14) {
          iVar3 = iVar14;
        }
        iVar19 = (int)(local_13e0[lVar17] * 7.3142858 + 1023.5);
        if (iVar19 < 1) {
          iVar19 = 0;
        }
        if (0x3fe < iVar19) {
          iVar19 = 0x3ff;
        }
        iVar8 = (iVar14 / iVar16) * iVar16;
        iVar2 = -iVar8;
        if (iVar8 < 1) {
          iVar2 = iVar8;
        }
        local_1404 = uVar21;
        local_13cc = uVar6;
        local_13b8 = lVar10;
        local_13b0 = lVar13;
        if (local_13e0[lVar17] <= local_13e8[lVar17] + info->twofitatten) {
          if (((float)iVar19 <= info->maxover + (float)(int)uVar21) &&
             ((float)(int)uVar21 - info->maxunder <= (float)iVar19)) goto LAB_001bf2ef;
        }
        else {
LAB_001bf2ef:
          local_13c4 = iVar14 >> 0x1f | 1;
          uVar12 = (uVar21 - iVar19) * (uVar21 - iVar19);
          iVar19 = 0;
          for (uVar20 = 1; (long)(lVar17 + uVar20) < local_1398; uVar20 = uVar20 + 1) {
            iVar19 = iVar19 + iVar3 + iVar2;
            uVar9 = 0;
            iVar8 = 0;
            if (iVar16 <= iVar19) {
              uVar9 = local_13c4;
              iVar8 = iVar16;
            }
            iVar22 = (int)(local_13e0[lVar17 + uVar20] * 7.3142858 + 1023.5);
            iVar18 = iVar22;
            if (iVar22 < 1) {
              iVar18 = 0;
            }
            if (0x3fe < iVar18) {
              iVar18 = 0x3ff;
            }
            uVar21 = uVar21 + iVar14 / iVar16 + uVar9;
            if ((local_13e0[lVar17 + uVar20] <= local_13e8[lVar17 + uVar20] + info->twofitatten) &&
               (0 < iVar22)) {
              if ((info->maxover + (float)(int)uVar21 < (float)iVar18) ||
                 ((float)iVar18 < (float)(int)uVar21 - info->maxunder)) goto LAB_001bf49d;
            }
            iVar19 = iVar19 - iVar8;
            uVar12 = uVar12 + (uVar21 - iVar18) * (uVar21 - iVar18);
          }
          fVar1 = info->maxerr;
          if (((fVar1 < (info->maxover * info->maxover) / (float)(int)uVar20) ||
              (fVar1 < (info->maxunder * info->maxunder) / (float)(int)uVar20)) ||
             ((float)(int)((ulong)uVar12 / (uVar20 & 0xffffffff)) <= fVar1)) {
            fit_valueA[lVar15] = -200;
            fit_valueB[lVar15] = -200;
            look = local_13f8;
            lVar10 = local_13f0;
            goto LAB_001bf62b;
          }
        }
LAB_001bf49d:
        ly0 = -200;
        ly1 = -200;
        hy0 = -200;
        hy1 = -200;
        iVar3 = fit_line(fits + local_13a8,iVar4 - iVar5,&ly0,&ly1,info);
        iVar5 = fit_line(fits + lVar11,local_13c8 - iVar4,&hy0,&hy1,info);
        if (iVar3 != 0) {
          ly0 = local_1404;
          ly1 = hy0;
        }
        lVar15 = local_13d8;
        look = local_13f8;
        lVar10 = local_13f0;
        if (iVar5 != 0) {
          hy0 = ly1;
          hy1 = local_13cc;
          if (iVar3 != 0) {
            fit_valueA[local_13d8] = -200;
            fit_valueB[local_13d8] = -200;
            goto LAB_001bf62b;
          }
        }
        fit_valueB[local_13b0] = ly0;
        if ((int)local_13b0 == 0) {
          fit_valueA[local_13b0] = ly0;
        }
        fit_valueA[local_13d8] = ly1;
        fit_valueB[local_13d8] = hy0;
        fit_valueA[local_13b8] = hy1;
        if ((int)local_13b8 == 1) {
          fit_valueB[local_13b8] = hy1;
        }
        if (-1 < (ly1 & hy0)) {
          for (lVar13 = (long)(iVar4 + -1); (-1 < lVar13 && (hineighbor[lVar13] == local_13d0));
              lVar13 = lVar13 + -1) {
            hineighbor[lVar13] = (int)local_13d8;
          }
          while ((lVar11 = lVar11 + 1, lVar11 < local_13f0 &&
                 (loneighbor[lVar11] == (int)local_13b0))) {
            loneighbor[lVar11] = (int)local_13d8;
          }
        }
      }
LAB_001bf62b:
    }
    puVar7 = (uint *)_vorbis_block_alloc(local_13c0,lVar10 * 4);
    uVar12 = fit_valueB[0];
    if ((-1 < fit_valueA[0]) && (uVar12 = fit_valueA[0], -1 < fit_valueB[0])) {
      uVar12 = (uint)(fit_valueB[0] + fit_valueA[0]) >> 1;
    }
    *puVar7 = uVar12;
    uVar12 = fit_valueB[1];
    if ((-1 < fit_valueA[1]) && (uVar12 = fit_valueA[1], -1 < fit_valueB[1])) {
      uVar12 = (uint)(fit_valueB[1] + fit_valueA[1]) >> 1;
    }
    puVar7[1] = uVar12;
    for (lVar15 = 0; lVar15 + 2 < lVar10; lVar15 = lVar15 + 1) {
      uVar6 = render_point(info->postlist[look->loneighbor[lVar15]],
                           info->postlist[look->hineighbor[lVar15]],puVar7[look->loneighbor[lVar15]]
                           ,puVar7[look->hineighbor[lVar15]],info->postlist[lVar15 + 2]);
      uVar12 = fit_valueA[lVar15 + 2];
      uVar9 = fit_valueB[lVar15 + 2];
      uVar21 = uVar9;
      if ((-1 < (int)uVar12) && (uVar21 = uVar12, -1 < (int)uVar9)) {
        uVar21 = uVar9 + uVar12 >> 1;
      }
      uVar12 = uVar21;
      if (uVar6 == uVar21) {
        uVar12 = uVar6 | 0x8000;
      }
      if ((int)uVar21 < 0) {
        uVar12 = uVar6 | 0x8000;
      }
      puVar7[lVar15 + 2] = uVar12;
    }
  }
  return (int *)puVar7;
}

Assistant:

int *floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          const float *logmdct,   /* in */
                          const float *logmask){
  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long n=look->n;
  long posts=look->posts;
  long nonzero=0;
  lsfit_acc fits[VIF_POSIT+1];
  int fit_valueA[VIF_POSIT+2]; /* index by range list position */
  int fit_valueB[VIF_POSIT+2]; /* index by range list position */

  int loneighbor[VIF_POSIT+2]; /* sorted index of range list position (+2) */
  int hineighbor[VIF_POSIT+2];
  int *output=NULL;
  int memo[VIF_POSIT+2];

  for(i=0;i<posts;i++)fit_valueA[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)fit_valueB[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)loneighbor[i]=0; /* 0 for the implicit 0 post */
  for(i=0;i<posts;i++)hineighbor[i]=1; /* 1 for the implicit post at n */
  for(i=0;i<posts;i++)memo[i]=-1;      /* no neighbor yet */

  /* quantize the relevant floor points and collect them into line fit
     structures (one per minimal division) at the same time */
  if(posts==0){
    nonzero+=accumulate_fit(logmask,logmdct,0,n,fits,n,info);
  }else{
    for(i=0;i<posts-1;i++)
      nonzero+=accumulate_fit(logmask,logmdct,look->sorted_index[i],
                              look->sorted_index[i+1],fits+i,
                              n,info);
  }

  if(nonzero){
    /* start by fitting the implicit base case.... */
    int y0=-200;
    int y1=-200;
    fit_line(fits,posts-1,&y0,&y1,info);

    fit_valueA[0]=y0;
    fit_valueB[0]=y0;
    fit_valueB[1]=y1;
    fit_valueA[1]=y1;

    /* Non degenerate case */
    /* start progressive splitting.  This is a greedy, non-optimal
       algorithm, but simple and close enough to the best
       answer. */
    for(i=2;i<posts;i++){
      int sortpos=look->reverse_index[i];
      int ln=loneighbor[sortpos];
      int hn=hineighbor[sortpos];

      /* eliminate repeat searches of a particular range with a memo */
      if(memo[ln]!=hn){
        /* haven't performed this error search yet */
        int lsortpos=look->reverse_index[ln];
        int hsortpos=look->reverse_index[hn];
        memo[ln]=hn;

        {
          /* A note: we want to bound/minimize *local*, not global, error */
          int lx=info->postlist[ln];
          int hx=info->postlist[hn];
          int ly=post_Y(fit_valueA,fit_valueB,ln);
          int hy=post_Y(fit_valueA,fit_valueB,hn);

          if(ly==-1 || hy==-1){
            exit(1);
          }

          if(inspect_error(lx,hx,ly,hy,logmask,logmdct,info)){
            /* outside error bounds/begin search area.  Split it. */
            int ly0=-200;
            int ly1=-200;
            int hy0=-200;
            int hy1=-200;
            int ret0=fit_line(fits+lsortpos,sortpos-lsortpos,&ly0,&ly1,info);
            int ret1=fit_line(fits+sortpos,hsortpos-sortpos,&hy0,&hy1,info);

            if(ret0){
              ly0=ly;
              ly1=hy0;
            }
            if(ret1){
              hy0=ly1;
              hy1=hy;
            }

            if(ret0 && ret1){
              fit_valueA[i]=-200;
              fit_valueB[i]=-200;
            }else{
              /* store new edge values */
              fit_valueB[ln]=ly0;
              if(ln==0)fit_valueA[ln]=ly0;
              fit_valueA[i]=ly1;
              fit_valueB[i]=hy0;
              fit_valueA[hn]=hy1;
              if(hn==1)fit_valueB[hn]=hy1;

              if(ly1>=0 || hy0>=0){
                /* store new neighbor values */
                for(j=sortpos-1;j>=0;j--)
                  if(hineighbor[j]==hn)
                    hineighbor[j]=i;
                  else
                    break;
                for(j=sortpos+1;j<posts;j++)
                  if(loneighbor[j]==ln)
                    loneighbor[j]=i;
                  else
                    break;
              }
            }
          }else{
            fit_valueA[i]=-200;
            fit_valueB[i]=-200;
          }
        }
      }
    }

    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    output[0]=post_Y(fit_valueA,fit_valueB,0);
    output[1]=post_Y(fit_valueA,fit_valueB,1);

    /* fill in posts marked as not using a fit; we will zero
       back out to 'unused' when encoding them so long as curve
       interpolation doesn't force them into use */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=output[ln];
      int y1=output[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);
      int vx=post_Y(fit_valueA,fit_valueB,i);

      if(vx>=0 && predicted!=vx){
        output[i]=vx;
      }else{
        output[i]= predicted|0x8000;
      }
    }
  }

  return(output);

}